

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  long lVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawVert *pIVar4;
  float fVar5;
  ImGuiContext *pIVar6;
  ImDrawList *this;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ImGuiWindow *window_1;
  long lVar11;
  char *pcVar12;
  ImVec4 *buf_00;
  ImDrawCmd *pIVar13;
  int iVar14;
  unsigned_short *puVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ImGuiListClipper clipper;
  ImVec2 triangles_pos [3];
  char buf [300];
  undefined1 local_1d8 [12];
  undefined8 uStack_1cc;
  uint local_1c4;
  ImVec2 local_1b8;
  ImVec2 IStack_1b0;
  undefined8 local_1a8;
  ImDrawList *local_198;
  uint local_18c;
  ImDrawCmd *local_188;
  ImGuiContext *local_180;
  ulong local_178;
  ImVec2 local_170;
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  pcVar12 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar12 = draw_list->_OwnerName;
  }
  bVar7 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar12,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->DrawList == draw_list) {
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar6->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar7) {
      return;
    }
  }
  else {
    local_198 = &pIVar6->ForegroundDrawList;
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar7) {
        return;
      }
    }
    else {
      bVar8 = IsItemHovered(0);
      if (bVar8) {
        local_168[0].y = (window->Size).y + (window->Pos).y;
        local_168[0].x = (window->Size).x + (window->Pos).x;
        ImDrawList::AddRect(local_198,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar7) {
        return;
      }
      if (window->WasActive == false) {
        Text("(Note: owning Window is inactive: DrawList is not being rendered!)");
      }
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar13 = (draw_list->CmdBuffer).Data;
      iVar14 = 0;
      local_180 = pIVar6;
      do {
        if (pIVar13->UserCallback == (ImDrawCallback)0x0) {
          if (pIVar13->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              puVar15 = (unsigned_short *)0x0;
            }
            else {
              puVar15 = (draw_list->IdxBuffer).Data;
            }
            ImFormatString((char *)local_168,300,
                           "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           SUB84((double)(pIVar13->ClipRect).x,0),
                           SUB84((double)(pIVar13->ClipRect).y,0),(double)(pIVar13->ClipRect).z,
                           (double)(pIVar13->ClipRect).w,(ulong)pIVar13->ElemCount / 3,
                           pIVar13->TextureId);
            bVar7 = TreeNode((void *)(((long)pIVar13 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                     0x6db6db6db6db6db7),"%s",local_168);
            if ((show_drawcmd_clip_rects == true) &&
               (bVar8 = IsItemHovered(0), this = local_198, bVar8)) {
              local_1d8._0_4_ = (pIVar13->ClipRect).x;
              local_1d8._4_4_ = (pIVar13->ClipRect).y;
              local_1d8._8_4_ = (pIVar13->ClipRect).z;
              fVar5 = (pIVar13->ClipRect).w;
              uStack_1cc._0_4_ = (int)fVar5;
              local_1b8.x = 3.4028235e+38;
              local_1b8.y = 3.4028235e+38;
              IStack_1b0.x = -3.4028235e+38;
              IStack_1b0.y = -3.4028235e+38;
              if (0 < (int)pIVar13->ElemCount) {
                lVar11 = (long)iVar14;
                fVar18 = 3.4028235e+38;
                fVar17 = 3.4028235e+38;
                fVar20 = -3.4028235e+38;
                fVar19 = -3.4028235e+38;
                do {
                  if (puVar15 == (unsigned_short *)0x0) {
                    uVar10 = (uint)lVar11;
                  }
                  else {
                    uVar10 = (uint)puVar15[lVar11];
                  }
                  if ((draw_list->VtxBuffer).Size <= (int)uVar10) {
LAB_0014c2f1:
                    __assert_fail("i < Size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                                  ,0x4d8,"T &ImVector<ImDrawVert>::operator[](int) [T = ImDrawVert]"
                                 );
                  }
                  pIVar4 = (draw_list->VtxBuffer).Data;
                  fVar2 = pIVar4[(int)uVar10].pos.x;
                  if (fVar2 < fVar17) {
                    local_1b8.x = fVar2;
                    fVar17 = fVar2;
                  }
                  pIVar4 = pIVar4 + (int)uVar10;
                  fVar2 = (pIVar4->pos).y;
                  if (fVar2 < fVar18) {
                    local_1b8.y = fVar2;
                    fVar18 = fVar2;
                  }
                  fVar2 = (pIVar4->pos).x;
                  if (fVar19 < fVar2) {
                    IStack_1b0.x = fVar2;
                    fVar19 = fVar2;
                  }
                  fVar2 = (pIVar4->pos).y;
                  if (fVar20 < fVar2) {
                    IStack_1b0.y = fVar2;
                    fVar20 = fVar2;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 < (int)(pIVar13->ElemCount + iVar14));
              }
              local_1d8._0_4_ = (undefined4)(int)(float)local_1d8._0_4_;
              local_1d8._4_4_ = (undefined4)(int)(float)local_1d8._4_4_;
              local_1d8._8_4_ = (undefined4)(int)(float)local_1d8._8_4_;
              uStack_1cc._0_4_ = (int)(float)(int)fVar5;
              ImDrawList::AddRect(local_198,(ImVec2 *)local_1d8,(ImVec2 *)(local_1d8 + 8),0xffff00ff
                                  ,0.0,0xf,1.0);
              local_1b8.y = (float)(int)local_1b8.y;
              local_1b8.x = (float)(int)local_1b8.x;
              IStack_1b0.y = (float)(int)IStack_1b0.y;
              IStack_1b0.x = (float)(int)IStack_1b0.x;
              ImDrawList::AddRect(this,&local_1b8,&IStack_1b0,0xff00ffff,0.0,0xf,1.0);
            }
            if (bVar7) {
              Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d",
                   (ulong)pIVar13->ElemCount,(ulong)pIVar13->ElemCount / 3,(ulong)pIVar13->VtxOffset
                   ,(ulong)pIVar13->IdxOffset);
              local_1d8._0_4_ = (GImGui->CurrentWindow->DC).CursorPos.y;
              local_1d8._4_4_ = -1.0;
              local_1d8._8_4_ = pIVar13->ElemCount / 3;
              uStack_1cc._0_4_ = 0;
              uStack_1cc._4_4_ = -1;
              local_1c4 = 0xffffffff;
              local_188 = pIVar13;
              while (bVar7 = ImGuiListClipper::Step((ImGuiListClipper *)local_1d8), bVar7) {
                local_18c = local_1c4;
                if ((int)uStack_1cc._4_4_ < (int)local_1c4) {
                  uVar16 = (ulong)(uStack_1cc._4_4_ * 3 + iVar14);
                  uVar10 = uStack_1cc._4_4_;
                  do {
                    local_178 = (ulong)uVar10;
                    local_1b8.x = 0.0;
                    local_1b8.y = 0.0;
                    IStack_1b0.x = 0.0;
                    IStack_1b0.y = 0.0;
                    local_1a8 = 0;
                    lVar11 = 0;
                    buf_00 = local_168;
                    do {
                      lVar1 = (uVar16 & 0xffffffff) + lVar11;
                      if (puVar15 == (unsigned_short *)0x0) {
                        uVar10 = (uint)lVar1;
                      }
                      else {
                        uVar10 = (uint)puVar15[(int)uVar16 + lVar11];
                      }
                      if ((draw_list->VtxBuffer).Size <= (int)uVar10) goto LAB_0014c2f1;
                      pIVar4 = (draw_list->VtxBuffer).Data;
                      (&local_1b8)[lVar11] = pIVar4[(int)uVar10].pos;
                      pcVar12 = "    ";
                      if (lVar11 == 0) {
                        pcVar12 = "elem";
                      }
                      iVar9 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                             "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                             ,SUB84((double)pIVar4[(int)uVar10].pos.x,0),
                                             SUB84((double)pIVar4[(int)uVar10].pos.y,0),
                                             (double)pIVar4[(int)uVar10].uv.x,
                                             (double)pIVar4[(int)uVar10].uv.y,pcVar12,lVar1,
                                             (ulong)pIVar4[(int)uVar10].col);
                      buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar9);
                      lVar11 = lVar11 + 1;
                    } while (lVar11 != 3);
                    local_170.x = 0.0;
                    local_170.y = 0.0;
                    Selectable((char *)local_168,false,0,&local_170);
                    pIVar6 = local_180;
                    bVar7 = IsItemHovered(0);
                    if (bVar7) {
                      uVar10 = (pIVar6->ForegroundDrawList).Flags;
                      (pIVar6->ForegroundDrawList).Flags = uVar10 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_198,&local_1b8,3,0xff00ffff,true,1.0);
                      (pIVar6->ForegroundDrawList).Flags = uVar10;
                    }
                    uVar16 = (uVar16 & 0xffffffff) + 3;
                    uVar10 = (int)local_178 + 1;
                  } while (uVar10 != local_18c);
                }
              }
              TreePop();
              pIVar13 = local_188;
              if ((float)local_1d8._8_4_ != -NAN) {
                __assert_fail("ItemsCount == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                              ,0x6aa,"ImGuiListClipper::~ImGuiListClipper()");
              }
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar13->UserCallback,pIVar13->UserCallbackData);
        }
        iVar14 = iVar14 + pIVar13->ElemCount;
        pIVar13 = pIVar13 + 1;
      } while (pIVar13 < (draw_list->CmdBuffer).Data + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::Text("(Note: owning Window is inactive: DrawList is not being rendered!)");

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,0,255,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGui::Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d", pcmd->ElemCount, pcmd->ElemCount/3, pcmd->VtxOffset, pcmd->IdxOffset);
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "elem" : "    ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }